

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MaxDistanceShapeIndexTarget::VisitContainingShapes
          (S2MaxDistanceShapeIndexTarget *this,S2ShapeIndex *query_index,ShapeVisitor *visitor)

{
  S2ShapeIndex *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  S2MaxDistancePointTarget target;
  ReferencePoint ref;
  S2MaxDistancePointTarget local_80;
  VType local_60;
  VType VStack_58;
  VType local_50;
  char local_48;
  long *plVar5;
  
  pSVar1 = this->index_;
  uVar3 = (*pSVar1->_vptr_S2ShapeIndex[2])();
  if (uVar3 != 0) {
    uVar10 = 0;
    do {
      iVar4 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,uVar10);
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      if (plVar5 != (long *)0x0) {
        iVar4 = (**(code **)(*plVar5 + 0x30))(plVar5);
        if (iVar4 < 1) {
LAB_00201716:
          (**(code **)(*plVar5 + 0x28))(&local_60,plVar5);
          if (local_48 == '\x01') {
            local_80.super_S2MaxDistanceTarget._vptr_S2DistanceTarget =
                 (_func_int **)&PTR__S2DistanceTarget_002bc6b0;
            local_80.point_.c_[2] = local_50;
            local_80.point_.c_[0] = local_60;
            local_80.point_.c_[1] = VStack_58;
            bVar2 = S2MaxDistancePointTarget::VisitContainingShapes(&local_80,query_index,visitor);
            if (!bVar2) {
              return false;
            }
          }
        }
        else {
          bVar2 = false;
          iVar8 = 0;
          do {
            while( true ) {
              iVar7 = iVar8 + 1;
              uVar6 = (**(code **)(*plVar5 + 0x38))(plVar5,iVar8);
              if (uVar6 >> 0x20 != 0) break;
              iVar8 = iVar7;
              if (iVar7 == iVar4) {
                if (!bVar2) goto LAB_00201716;
                goto LAB_00201763;
              }
            }
            (**(code **)(*plVar5 + 0x40))(&local_60,plVar5,iVar8,0);
            local_80.super_S2MaxDistanceTarget._vptr_S2DistanceTarget =
                 (_func_int **)&PTR__S2DistanceTarget_002bc6b0;
            local_80.point_.c_[2] = local_50;
            local_80.point_.c_[0] = local_60;
            local_80.point_.c_[1] = VStack_58;
            bVar2 = S2MaxDistancePointTarget::VisitContainingShapes(&local_80,query_index,visitor);
            if (!bVar2) {
              return false;
            }
            bVar2 = true;
            iVar8 = iVar7;
          } while (iVar7 != iVar4);
        }
      }
LAB_00201763:
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != uVar3);
  }
  return true;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::VisitContainingShapes(
    const S2ShapeIndex& query_index, const ShapeVisitor& visitor) {
  // It is sufficient to find the set of chain starts in the target index
  // (i.e., one vertex per connected component of edges) that are contained by
  // the query index, except for one special case to handle full polygons.
  //
  // TODO(ericv): Do this by merge-joining the two S2ShapeIndexes, and share
  // the code with S2BooleanOperation.
  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_chains = shape->num_chains();
    // Shapes that don't have any edges require a special case (below).
    bool tested_point = false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain chain = shape->chain(c);
      if (chain.length == 0) continue;
      tested_point = true;
      S2MaxDistancePointTarget target(shape->chain_edge(c, 0).v0);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
    if (!tested_point) {
      // Special case to handle full polygons.
      S2Shape::ReferencePoint ref = shape->GetReferencePoint();
      if (!ref.contained) continue;
      S2MaxDistancePointTarget target(ref.point);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
  }
  return true;
}